

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O0

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  bool bVar1;
  OfType OVar2;
  uint uVar3;
  AssertionResult *this_00;
  pointer pMVar4;
  IConfig *pIVar5;
  XmlWriter *pXVar6;
  ScopedElement *pSVar7;
  undefined1 local_500 [40];
  string local_4d8 [32];
  undefined1 local_4b8 [8];
  undefined1 local_4b0 [40];
  string local_488 [32];
  undefined1 local_468 [8];
  undefined1 local_460 [80];
  string local_410 [32];
  SourceLineInfo local_3f0;
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  undefined1 local_378 [8];
  undefined1 local_370 [80];
  string local_320 [32];
  SourceLineInfo local_300;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [32];
  undefined1 local_288 [8];
  undefined1 local_280 [40];
  string local_258 [32];
  undefined1 local_238 [8];
  undefined1 local_230 [40];
  string local_208 [32];
  undefined1 local_1e8 [40];
  unsigned_long local_1c0;
  allocator local_1b1;
  string local_1b0 [32];
  SourceLineInfo local_190;
  allocator local_161;
  string local_160 [32];
  undefined1 local_140 [40];
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [32];
  string local_60 [32];
  undefined1 local_40 [16];
  const_iterator itEnd;
  const_iterator it;
  AssertionResult *assertionResult;
  AssertionStats *assertionStats_local;
  XmlReporter *this_local;
  
  this_00 = &assertionStats->assertionResult;
  OVar2 = AssertionResult::getResultType(&assertionStats->assertionResult);
  if (OVar2 != Ok) {
    itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                      (&assertionStats->infoMessages);
    local_40._8_8_ =
         std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                   (&assertionStats->infoMessages);
    while (bVar1 = __gnu_cxx::operator!=
                             (&itEnd,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                      *)(local_40 + 8)), bVar1) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      if (pMVar4->type == Info) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,"Info",(allocator *)(local_80 + 0x1f));
        XmlWriter::scopedElement((XmlWriter *)local_40,(string *)&this->m_xml);
        pMVar4 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        XmlWriter::ScopedElement::writeText((ScopedElement *)local_40,&pMVar4->message,true);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_40);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0x1f));
      }
      else {
        pMVar4 = __gnu_cxx::
                 __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                 ::operator->(&itEnd);
        if (pMVar4->type == Warning) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a0,"Warning",&local_a1);
          XmlWriter::scopedElement((XmlWriter *)local_80,(string *)&this->m_xml);
          pMVar4 = __gnu_cxx::
                   __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                   ::operator->(&itEnd);
          XmlWriter::ScopedElement::writeText((ScopedElement *)local_80,&pMVar4->message,true);
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
          std::__cxx11::string::~string(local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
      ::operator++(&itEnd);
    }
  }
  pIVar5 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  uVar3 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if ((uVar3 & 1) == 0) {
    OVar2 = AssertionResult::getResultType(this_00);
    bVar1 = isOk(OVar2);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = AssertionResult::hasExpression(this_00);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Expression",&local_c9);
    pXVar6 = XmlWriter::startElement(&this->m_xml,(string *)local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"success",&local_f1);
    bVar1 = AssertionResult::succeeded(this_00);
    pXVar6 = XmlWriter::writeAttribute(pXVar6,(string *)local_f0,bVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"type",(allocator *)(local_140 + 0x27));
    AssertionResult::getTestMacroName_abi_cxx11_((AssertionResult *)local_140);
    pXVar6 = XmlWriter::writeAttribute(pXVar6,(string *)local_118,(string *)local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"filename",&local_161);
    AssertionResult::getSourceInfo(&local_190,this_00);
    pXVar6 = XmlWriter::writeAttribute(pXVar6,(string *)local_160,&local_190.file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"line",&local_1b1);
    AssertionResult::getSourceInfo((SourceLineInfo *)(local_1e8 + 8),this_00);
    XmlWriter::writeAttribute<unsigned_long>(pXVar6,(string *)local_1b0,&local_1c0);
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_1e8 + 8));
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    SourceLineInfo::~SourceLineInfo(&local_190);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x27));
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_208,"Original",(allocator *)(local_230 + 0x27));
    XmlWriter::scopedElement((XmlWriter *)local_1e8,(string *)&this->m_xml);
    AssertionResult::getExpression_abi_cxx11_((AssertionResult *)local_230);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_1e8,(string *)local_230,true);
    std::__cxx11::string::~string((string *)local_230);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1e8);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator((allocator<char> *)(local_230 + 0x27));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_258,"Expanded",(allocator *)(local_280 + 0x27));
    XmlWriter::scopedElement((XmlWriter *)local_238,(string *)&this->m_xml);
    AssertionResult::getExpandedExpression_abi_cxx11_((AssertionResult *)local_280);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_238,(string *)local_280,true);
    std::__cxx11::string::~string((string *)local_280);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_238);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator((allocator<char> *)(local_280 + 0x27));
  }
  OVar2 = AssertionResult::getResultType(this_00);
  if (OVar2 == Info) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_488,"Info",(allocator *)(local_4b0 + 0x27));
    XmlWriter::scopedElement((XmlWriter *)local_468,(string *)&this->m_xml);
    AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_4b0);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_468,(string *)local_4b0,true);
    std::__cxx11::string::~string((string *)local_4b0);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_468);
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator((allocator<char> *)(local_4b0 + 0x27));
  }
  else if (OVar2 != Warning) {
    if (OVar2 == ExplicitFailure) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d8,"Failure",(allocator *)(local_500 + 0x27));
      XmlWriter::scopedElement((XmlWriter *)local_4b8,(string *)&this->m_xml);
      AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_500);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_4b8,(string *)local_500,true);
      std::__cxx11::string::~string((string *)local_500);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_4b8);
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)(local_500 + 0x27));
    }
    else if (OVar2 == ThrewException) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"Exception",&local_2a9);
      XmlWriter::scopedElement((XmlWriter *)local_288,(string *)&this->m_xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"filename",&local_2d1);
      AssertionResult::getSourceInfo(&local_300,this_00);
      pSVar7 = XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                         ((ScopedElement *)local_288,(string *)local_2d0,&local_300.file);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,"line",(allocator *)(local_370 + 0x4f));
      AssertionResult::getSourceInfo((SourceLineInfo *)(local_370 + 0x20),this_00);
      pSVar7 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                         (pSVar7,(string *)local_320,(unsigned_long *)(local_370 + 0x40));
      AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_370);
      XmlWriter::ScopedElement::writeText(pSVar7,(string *)local_370,true);
      std::__cxx11::string::~string((string *)local_370);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_370 + 0x20));
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)(local_370 + 0x4f));
      SourceLineInfo::~SourceLineInfo(&local_300);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_288);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    }
    else if (OVar2 == FatalErrorCondition) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_398,"Fatal Error Condition",&local_399);
      XmlWriter::scopedElement((XmlWriter *)local_378,(string *)&this->m_xml);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c0,"filename",&local_3c1);
      AssertionResult::getSourceInfo(&local_3f0,this_00);
      pSVar7 = XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                         ((ScopedElement *)local_378,(string *)local_3c0,&local_3f0.file);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_410,"line",(allocator *)(local_460 + 0x4f));
      AssertionResult::getSourceInfo((SourceLineInfo *)(local_460 + 0x20),this_00);
      pSVar7 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                         (pSVar7,(string *)local_410,(unsigned_long *)(local_460 + 0x40));
      AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_460);
      XmlWriter::ScopedElement::writeText(pSVar7,(string *)local_460,true);
      std::__cxx11::string::~string((string *)local_460);
      SourceLineInfo::~SourceLineInfo((SourceLineInfo *)(local_460 + 0x20));
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)(local_460 + 0x4f));
      SourceLineInfo::~SourceLineInfo(&local_3f0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_378);
      std::__cxx11::string::~string(local_398);
      std::allocator<char>::~allocator((allocator<char> *)&local_399);
    }
  }
  bVar1 = AssertionResult::hasExpression(this_00);
  if (bVar1) {
    XmlWriter::endElement(&this->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) {
            const AssertionResult& assertionResult = assertionStats.assertionResult;
                
            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "Fatal Error Condition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }
            
            if( assertionResult.hasExpression() )
                m_xml.endElement();
                
            return true;
        }